

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ssls.c
# Opt level: O0

CURLcode tool_ssls_save(GlobalConfig *global,OperationConfig *config,CURLSH *share,char *filename)

{
  CURLcode local_4c;
  CURL *pCStack_48;
  CURLcode r;
  CURL *easy;
  tool_ssls_ctx ctx;
  char *filename_local;
  CURLSH *share_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  pCStack_48 = (CURL *)0x0;
  local_4c = CURLE_OK;
  ctx.fp._0_4_ = 0;
  easy = global;
  ctx._16_8_ = filename;
  ctx.global = (GlobalConfig *)fopen64(filename,"w");
  if ((FILE *)ctx.global == (FILE *)0x0) {
    warnf(global,"Warning: Failed to create SSL session file %s",ctx._16_8_);
  }
  else {
    local_4c = tool_ssls_easy(global,config,share,&stack0xffffffffffffffb8);
    if (local_4c == CURLE_OK) {
      local_4c = curl_easy_ssls_export(pCStack_48,tool_ssls_exp,&easy);
    }
  }
  if (pCStack_48 != (CURL *)0x0) {
    curl_easy_cleanup(pCStack_48);
  }
  if (ctx.global != (GlobalConfig *)0x0) {
    fclose((FILE *)ctx.global);
  }
  return local_4c;
}

Assistant:

CURLcode tool_ssls_save(struct GlobalConfig *global,
                        struct OperationConfig *config,
                        CURLSH *share, const char *filename)
{
  struct tool_ssls_ctx ctx;
  CURL *easy = NULL;
  CURLcode r = CURLE_OK;

  ctx.global = global;
  ctx.exported = 0;
  ctx.fp = fopen(filename, FOPEN_WRITETEXT);
  if(!ctx.fp) {
    warnf(global, "Warning: Failed to create SSL session file %s", filename);
    goto out;
  }

  r = tool_ssls_easy(global, config, share, &easy);
  if(r)
    goto out;

  r = curl_easy_ssls_export(easy, tool_ssls_exp, &ctx);

out:
  if(easy)
    curl_easy_cleanup(easy);
  if(ctx.fp)
    fclose(ctx.fp);
  return r;
}